

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation2d.cpp
# Opt level: O2

void save_data(vector<double,_std::allocator<double>_> *x,vector<double,_std::allocator<double>_> *y
              ,vector<double,_std::allocator<double>_> *data,string *name)

{
  pointer pdVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  ofstream file;
  
  std::ofstream::ofstream(&file);
  _Var2 = std::__cxx11::string::append((char *)name);
  std::ofstream::open((string *)&file,_Var2);
  for (uVar4 = 0;
      pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar4 = uVar4 + 1) {
    poVar3 = std::ostream::_M_insert<double>(pdVar1[uVar4]);
    std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<double>
                       ((y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar4]);
    std::operator<<(poVar3," ");
    poVar3 = std::ostream::_M_insert<double>
                       ((data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar4]);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void save_data(std::vector<double> x, std::vector<double> y,
               std::vector<double> data, std::string name) {
  ofstream file;
  file.open(name.append(".dat"));
  for (int i = 0; i < x.size(); i++) {
    file << x[i] << " " << y[i] << " " << data[i] << std::endl;
  }
  file.close();
}